

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O2

Params * adios2::helper::anon_unknown_0::YAMLNodeMapToParams
                   (Params *__return_storage_ptr__,Node *node,string *hint)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar3;
  allocator local_21b;
  allocator local_21a;
  allocator local_219;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_218;
  string *local_210;
  Node *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string value;
  const_iterator itParam;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string key;
  iterator_value local_f0;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_218 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               *)__return_storage_ptr__;
  local_210 = hint;
  local_208 = node;
  YAML::Node::begin(&itParam,node);
  while( true ) {
    YAML::Node::end((const_iterator *)&local_f0,local_208);
    bVar2 = YAML::detail::node_iterator_base<YAML::detail::node>::operator!=
                      (&itParam.m_iterator,(node_iterator_base<YAML::detail::node> *)&local_f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0.super_Node.m_pMemory);
    if (!bVar2) break;
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
              ((proxy *)&local_f0,&itParam);
    YAML::Node::as<std::__cxx11::string>(&key,&local_f0.super_pair<YAML::Node,_YAML::Node>.first);
    YAML::detail::iterator_value::~iterator_value(&local_f0);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
              ((proxy *)&local_f0,&itParam);
    YAML::Node::as<std::__cxx11::string>(&value,&local_f0.super_pair<YAML::Node,_YAML::Node>.second)
    ;
    YAML::detail::iterator_value::~iterator_value(&local_f0);
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      (local_218,&key,&value);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::string::string((string *)&local_f0,"Helper",&local_219);
      std::__cxx11::string::string((string *)&local_1a0,"adiosYAML",&local_21a);
      std::__cxx11::string::string((string *)&local_1c0,"YAMLNodeMapToParams",&local_21b);
      std::operator+(&local_200,"found duplicated key : ",&key);
      std::operator+(&local_1e0,&local_200,", keys must be unique in a YAML node, ");
      std::operator+(&local_130,&local_1e0,local_210);
      Throw<std::invalid_argument>((string *)&local_f0,&local_1a0,&local_1c0,&local_130,-1);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&key);
    YAML::detail::node_iterator_base<YAML::detail::node>::operator++(&itParam.m_iterator);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itParam.m_pMemory.
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (Params *)local_218;
}

Assistant:

Params YAMLNodeMapToParams(const YAML::Node &node, const std::string &hint)
{
    Params parameters;
    for (auto itParam = node.begin(); itParam != node.end(); ++itParam)
    {
        const std::string key = itParam->first.as<std::string>();
        const std::string value = itParam->second.as<std::string>();
        auto it = parameters.emplace(key, value);
        if (!it.second)
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "adiosYAML", "YAMLNodeMapToParams",
                "found duplicated key : " + key + ", keys must be unique in a YAML node, " + hint);
        }
    }
    return parameters;
}